

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O1

void ncnn::gridsample_3d_bilinear_apply_interpolation_p4
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  int *offset_ptr;
  int *piVar10;
  float fVar11;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  iVar3 = dst->c;
  if (0 < (long)iVar3) {
    iVar5 = dst->h * dst->w * dst->d;
    lVar7 = 0;
    do {
      if (0 < iVar5) {
        lVar8 = src->cstep * lVar7 * src->elemsize;
        pvVar4 = src->data;
        piVar10 = (int *)offset_value->data;
        pauVar9 = (undefined1 (*) [16])(dst->cstep * lVar7 * dst->elemsize + (long)dst->data);
        iVar6 = iVar5;
        do {
          fVar11 = 0.0;
          fVar15 = 0.0;
          fVar16 = 0.0;
          fVar17 = 0.0;
          auVar18 = ZEXT816(0) << 0x40;
          if (-1 < (long)*piVar10) {
            auVar18 = *(undefined1 (*) [16])((long)pvVar4 + (long)*piVar10 * 4 + lVar8);
          }
          if (-1 < (long)piVar10[1]) {
            pfVar1 = (float *)((long)pvVar4 + (long)piVar10[1] * 4 + lVar8);
            fVar11 = *pfVar1;
            fVar15 = pfVar1[1];
            fVar16 = pfVar1[2];
            fVar17 = pfVar1[3];
          }
          auVar19 = ZEXT816(0) << 0x40;
          auVar14 = ZEXT816(0) << 0x40;
          if (-1 < (long)piVar10[2]) {
            auVar14 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[2] * 4 + lVar8);
          }
          if (-1 < (long)piVar10[3]) {
            auVar19 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[3] * 4 + lVar8);
          }
          fVar23 = 0.0;
          fVar24 = 0.0;
          fVar25 = 0.0;
          fVar26 = 0.0;
          auVar13 = ZEXT816(0) << 0x40;
          if (-1 < (long)piVar10[4]) {
            auVar13 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[4] * 4 + lVar8);
          }
          if (-1 < (long)piVar10[5]) {
            pfVar1 = (float *)((long)pvVar4 + (long)piVar10[5] * 4 + lVar8);
            fVar23 = *pfVar1;
            fVar24 = pfVar1[1];
            fVar25 = pfVar1[2];
            fVar26 = pfVar1[3];
          }
          auVar22 = ZEXT816(0) << 0x40;
          auVar27 = ZEXT816(0) << 0x40;
          if (-1 < (long)piVar10[6]) {
            auVar27 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[6] * 4 + lVar8);
          }
          if (-1 < (long)piVar10[7]) {
            auVar22 = *(undefined1 (*) [16])((long)pvVar4 + (long)piVar10[7] * 4 + lVar8);
          }
          fVar2 = (float)piVar10[8];
          auVar28._0_4_ = fVar2 * auVar18._0_4_;
          auVar28._4_4_ = fVar2 * auVar18._4_4_;
          auVar28._8_4_ = fVar2 * auVar18._8_4_;
          auVar28._12_4_ = fVar2 * auVar18._12_4_;
          auVar18 = vsubps_avx(auVar18,auVar28);
          auVar12._0_4_ = auVar18._0_4_ + fVar2 * fVar11;
          auVar12._4_4_ = auVar18._4_4_ + fVar2 * fVar15;
          auVar12._8_4_ = auVar18._8_4_ + fVar2 * fVar16;
          auVar12._12_4_ = auVar18._12_4_ + fVar2 * fVar17;
          auVar18 = vsubps_avx(auVar19,auVar14);
          auVar20._0_4_ = fVar2 * auVar13._0_4_;
          auVar20._4_4_ = fVar2 * auVar13._4_4_;
          auVar20._8_4_ = fVar2 * auVar13._8_4_;
          auVar20._12_4_ = fVar2 * auVar13._12_4_;
          auVar19 = vsubps_avx(auVar13,auVar20);
          auVar21._0_4_ = auVar19._0_4_ + fVar2 * fVar23;
          auVar21._4_4_ = auVar19._4_4_ + fVar2 * fVar24;
          auVar21._8_4_ = auVar19._8_4_ + fVar2 * fVar25;
          auVar21._12_4_ = auVar19._12_4_ + fVar2 * fVar26;
          auVar19 = vsubps_avx(auVar22,auVar27);
          auVar22._0_4_ = fVar2 * auVar19._0_4_ + auVar27._0_4_;
          auVar22._4_4_ = fVar2 * auVar19._4_4_ + auVar27._4_4_;
          auVar22._8_4_ = fVar2 * auVar19._8_4_ + auVar27._8_4_;
          auVar22._12_4_ = fVar2 * auVar19._12_4_ + auVar27._12_4_;
          fVar11 = (float)piVar10[9];
          auVar27._0_4_ = auVar12._0_4_ * fVar11;
          auVar27._4_4_ = auVar12._4_4_ * fVar11;
          auVar27._8_4_ = auVar12._8_4_ * fVar11;
          auVar27._12_4_ = auVar12._12_4_ * fVar11;
          auVar19 = vsubps_avx(auVar12,auVar27);
          auVar13._0_4_ = auVar19._0_4_ + (fVar2 * auVar18._0_4_ + auVar14._0_4_) * fVar11;
          auVar13._4_4_ = auVar19._4_4_ + (fVar2 * auVar18._4_4_ + auVar14._4_4_) * fVar11;
          auVar13._8_4_ = auVar19._8_4_ + (fVar2 * auVar18._8_4_ + auVar14._8_4_) * fVar11;
          auVar13._12_4_ = auVar19._12_4_ + (fVar2 * auVar18._12_4_ + auVar14._12_4_) * fVar11;
          auVar18 = vsubps_avx(auVar22,auVar21);
          auVar19._0_4_ = auVar18._0_4_ * fVar11 + auVar21._0_4_;
          auVar19._4_4_ = auVar18._4_4_ * fVar11 + auVar21._4_4_;
          auVar19._8_4_ = auVar18._8_4_ * fVar11 + auVar21._8_4_;
          auVar19._12_4_ = auVar18._12_4_ * fVar11 + auVar21._12_4_;
          fVar11 = (float)piVar10[10];
          auVar18 = vsubps_avx(auVar19,auVar13);
          auVar14._0_4_ = auVar18._0_4_ * fVar11 + auVar13._0_4_;
          auVar14._4_4_ = auVar18._4_4_ * fVar11 + auVar13._4_4_;
          auVar14._8_4_ = auVar18._8_4_ * fVar11 + auVar13._8_4_;
          auVar14._12_4_ = auVar18._12_4_ * fVar11 + auVar13._12_4_;
          *pauVar9 = auVar14;
          pauVar9 = pauVar9 + 1;
          piVar10 = piVar10 + 0xb;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar3);
  }
  return;
}

Assistant:

static void gridsample_3d_bilinear_apply_interpolation_p4(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int outd = dst.d;
    const int grid_size = outw * outh * outd;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 8;

            __m128 v000_val = offset_ptr[0] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[0]) : _mm_set1_ps(0);
            __m128 v001_val = offset_ptr[1] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[1]) : _mm_set1_ps(0);
            __m128 v010_val = offset_ptr[2] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[2]) : _mm_set1_ps(0);
            __m128 v011_val = offset_ptr[3] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[3]) : _mm_set1_ps(0);

            __m128 v100_val = offset_ptr[4] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[4]) : _mm_set1_ps(0);
            __m128 v101_val = offset_ptr[5] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[5]) : _mm_set1_ps(0);
            __m128 v110_val = offset_ptr[6] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[6]) : _mm_set1_ps(0);
            __m128 v111_val = offset_ptr[7] >= 0 ? _mm_loadu_ps(srcptr + offset_ptr[7]) : _mm_set1_ps(0);

            __m128 value = _mm_set1_ps(value_ptr[0]);
            __m128 v00 = _mm_comp_fmadd_ps(v001_val, value, _mm_comp_fnmadd_ps(v000_val, value, v000_val));
            __m128 v01 = _mm_comp_fmadd_ps(v011_val, value, _mm_comp_fnmadd_ps(v010_val, value, v010_val));
            __m128 v10 = _mm_comp_fmadd_ps(v101_val, value, _mm_comp_fnmadd_ps(v100_val, value, v100_val));
            __m128 v11 = _mm_comp_fmadd_ps(v111_val, value, _mm_comp_fnmadd_ps(v110_val, value, v110_val));

            value = _mm_set1_ps(value_ptr[1]);
            __m128 v0 = _mm_comp_fmadd_ps(v01, value, _mm_comp_fnmadd_ps(v00, value, v00));
            __m128 v1 = _mm_comp_fmadd_ps(v11, value, _mm_comp_fnmadd_ps(v10, value, v10));

            value = _mm_set1_ps(value_ptr[2]);
            __m128 _v = _mm_comp_fmadd_ps(v1, value, _mm_comp_fnmadd_ps(v0, value, v0));
            _mm_storeu_ps(dstptr, _v);

            dstptr += 4;
            offset_value_ptr += 11;
        }
    }
}